

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O2

void __thiscall xercesc_4_0::CMStateSet::operator|=(CMStateSet *this,CMStateSet *setToOr)

{
  ulong *puVar1;
  ulong *puVar2;
  uint *puVar3;
  uint uVar4;
  XMLInt32 **ppXVar5;
  XMLInt32 *pXVar6;
  XMLInt32 **ppXVar7;
  XMLInt32 *pXVar8;
  ulong uVar9;
  ulong uVar10;
  XMLSize_t subIndex;
  ulong uVar11;
  CMDynamicBuffer *pCVar12;
  XMLSize_t subIndex_1;
  long lVar13;
  XMLSize_t index;
  ulong uVar14;
  
  pCVar12 = this->fDynamicBuffer;
  if (pCVar12 == (CMDynamicBuffer *)0x0) {
    if (XMLPlatformUtils::fgSSE2ok == '\0') {
      for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
        if (setToOr->fBits[lVar13] != 0) {
          this->fBits[lVar13] = this->fBits[lVar13] | setToOr->fBits[lVar13];
        }
      }
    }
    else {
      uVar14 = *(ulong *)(setToOr->fBits + 2);
      *(ulong *)this->fBits = *(ulong *)setToOr->fBits | *(ulong *)this->fBits;
      *(ulong *)(this->fBits + 2) = uVar14 | *(ulong *)(this->fBits + 2);
    }
  }
  else {
    for (uVar14 = 0; uVar14 < pCVar12->fArraySize; uVar14 = uVar14 + 1) {
      ppXVar5 = setToOr->fDynamicBuffer->fBitArray;
      pXVar6 = ppXVar5[uVar14];
      if (pXVar6 != (XMLInt32 *)0x0) {
        ppXVar7 = pCVar12->fBitArray;
        pXVar8 = ppXVar7[uVar14];
        if (pXVar8 == (XMLInt32 *)0x0) {
          allocateChunk(this,uVar14);
          memcpy(this->fDynamicBuffer->fBitArray[uVar14],ppXVar5[uVar14],0x80);
        }
        else if (XMLPlatformUtils::fgSSE2ok == '\0') {
          for (lVar13 = 0; lVar13 != 0x20; lVar13 = lVar13 + 1) {
            uVar4 = pXVar6[lVar13];
            if (uVar4 != 0) {
              puVar3 = (uint *)(pXVar8 + lVar13);
              *puVar3 = *puVar3 | uVar4;
            }
          }
        }
        else {
          for (uVar11 = 0; uVar11 < 0x20; uVar11 = uVar11 + 4) {
            pXVar6 = ppXVar7[uVar14];
            puVar1 = (ulong *)(pXVar6 + uVar11);
            uVar9 = puVar1[1];
            uVar10 = *(ulong *)((long)(ppXVar5[uVar14] + uVar11) + 8);
            puVar2 = (ulong *)(pXVar6 + uVar11);
            *puVar2 = *puVar1 | *(ulong *)(ppXVar5[uVar14] + uVar11);
            puVar2[1] = uVar9 | uVar10;
          }
        }
      }
      pCVar12 = this->fDynamicBuffer;
    }
  }
  return;
}

Assistant:

void operator|=(const CMStateSet& setToOr)
    {
        if(fDynamicBuffer==0)
        {
#ifdef XERCES_HAVE_SSE2_INTRINSIC
            if(XMLPlatformUtils::fgSSE2ok)
            {
                __m128i xmm1 = _mm_loadu_si128(reinterpret_cast<const __m128i*>(fBits));
                __m128i xmm2 = _mm_loadu_si128(reinterpret_cast<const __m128i*>(setToOr.fBits));
                __m128i xmm3 = _mm_or_si128(xmm1, xmm2);     //  OR  4 32-bit words
                _mm_storeu_si128(reinterpret_cast<__m128i*>(fBits), xmm3);
            }
            else
#endif
            {
                for (XMLSize_t index = 0; index < CMSTATE_CACHED_INT32_SIZE; index++)
                    if(setToOr.fBits[index])
                    {
                        if(fBits[index])
                            fBits[index] |= setToOr.fBits[index];
                        else
                            fBits[index] = setToOr.fBits[index];
                    }
            }
        }
        else
        {
            for (XMLSize_t index = 0; index < fDynamicBuffer->fArraySize; index++)
            {
                XMLInt32 *& other = setToOr.fDynamicBuffer->fBitArray[index];
                if(other!=NULL)
                {
                    // if we haven't allocated the subvector yet, allocate it and copy
                    if(fDynamicBuffer->fBitArray[index]==NULL)
                    {
                        allocateChunk(index);
                        memcpy((void *) fDynamicBuffer->fBitArray[index],
                               (const void *) other,
                               CMSTATE_BITFIELD_INT32_SIZE * sizeof(XMLInt32));
                    }
                    else
                    {
                        // otherwise, merge them
                        XMLInt32*& mine = fDynamicBuffer->fBitArray[index];
#ifdef XERCES_HAVE_SSE2_INTRINSIC
                        if(XMLPlatformUtils::fgSSE2ok)
                        {
                            for(XMLSize_t subIndex = 0; subIndex < CMSTATE_BITFIELD_INT32_SIZE; subIndex+=4)
                            {
                               __m128i xmm1 = _mm_load_si128(reinterpret_cast<const __m128i*>(&other[subIndex]));
                               __m128i xmm2 = _mm_load_si128(reinterpret_cast<const __m128i*>(&mine[subIndex]));
                               __m128i xmm3 = _mm_or_si128(xmm1, xmm2);     //  OR  4 32-bit words
                               _mm_store_si128(reinterpret_cast<__m128i*>(&mine[subIndex]), xmm3);
                            }
                        }
                        else
#endif
                        {
                            for(XMLSize_t subIndex = 0; subIndex < CMSTATE_BITFIELD_INT32_SIZE; subIndex++)
                                if(setToOr.fDynamicBuffer->fBitArray[index][subIndex])
                                {
                                    if(fDynamicBuffer->fBitArray[index][subIndex])
                                        fDynamicBuffer->fBitArray[index][subIndex] |= setToOr.fDynamicBuffer->fBitArray[index][subIndex];
                                    else
                                        fDynamicBuffer->fBitArray[index][subIndex] = setToOr.fDynamicBuffer->fBitArray[index][subIndex];
                                }
                        }
                    }
                }
            }
        }
    }